

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

string * __thiscall
AlignmentRecord::getAlignSequence2_abi_cxx11_(string *__return_storage_ptr__,AlignmentRecord *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->alignSequence2);
  return __return_storage_ptr__;
}

Assistant:

std::string AlignmentRecord::getAlignSequence2() const{
    return this->alignSequence2;
}